

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

int __thiscall LinkedObjectFile::get_label_id_for(LinkedObjectFile *this,int seg,int offset)

{
  vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  *this_00;
  uint __line;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  iterator iVar1;
  reference pvVar2;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_02;
  mapped_type *pmVar3;
  int __val;
  char *__assertion;
  size_type __n;
  int offset_local;
  string local_98;
  Label label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->label_per_seg_by_offset;
  __n = (size_type)seg;
  offset_local = offset;
  this_01 = &std::
             vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
             ::at(this_00,__n)->_M_h;
  iVar1 = std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(this_01,&offset_local);
  std::
  vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ::at(this_00,__n);
  if (iVar1.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur == (__node_type *)0x0
     ) {
    label.name._M_dataplus._M_p = (pointer)&label.name.field_2;
    label.name._M_string_length = 0;
    label.name.field_2._M_local_buf[0] = '\0';
    label.offset = offset_local;
    __val = (int)(((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x28);
    label.target_segment = seg;
    std::__cxx11::to_string(&local_98,__val);
    std::operator+(&local_50,"L",&local_98);
    std::__cxx11::string::operator=((string *)&label,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_98);
    this_02 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)std::
                 vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                 ::at(this_00,__n);
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](this_02,&offset_local);
    *pmVar3 = __val;
    std::vector<Label,_std::allocator<Label>_>::push_back(&this->labels,&label);
    std::__cxx11::string::~string((string *)&label);
    return __val;
  }
  pvVar2 = std::vector<Label,_std::allocator<Label>_>::at
                     (&this->labels,
                      (long)*(int *)((long)iVar1.
                                           super__Node_iterator_base<std::pair<const_int,_int>,_false>
                                           ._M_cur + 0xc));
  if (pvVar2->offset == offset_local) {
    if (pvVar2->target_segment == seg) {
      return *(int *)((long)iVar1.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur
                     + 0xc);
    }
    __assertion = "label.target_segment == seg";
    __line = 0x35;
  }
  else {
    __assertion = "label.offset == offset";
    __line = 0x34;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                ,__line,"int LinkedObjectFile::get_label_id_for(int, int)");
}

Assistant:

int LinkedObjectFile::get_label_id_for(int seg, int offset) {
  auto kv = label_per_seg_by_offset.at(seg).find(offset);
  if (kv == label_per_seg_by_offset.at(seg).end()) {
    // create a new label
    int id = labels.size();
    Label label;
    label.target_segment = seg;
    label.offset = offset;
    label.name = "L" + std::to_string(id);
    label_per_seg_by_offset.at(seg)[offset] = id;
    labels.push_back(label);
    return id;
  } else {
    // return an existing label
    auto& label = labels.at(kv->second);
    assert(label.offset == offset);
    assert(label.target_segment == seg);
    return kv->second;
  }
}